

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase697::run(TestCase697 *this)

{
  bool bVar1;
  uint *puVar2;
  uchar *puVar3;
  char *pcVar4;
  char local_f84;
  bool local_f83;
  char local_f82;
  DebugExpression<char> local_f81;
  undefined1 local_f80 [5];
  bool _kj_shouldLog_65;
  DebugComparison<char,_const_char_&> _kjCondition_70;
  undefined1 local_f50 [5];
  bool _kj_shouldLog_64;
  DebugComparison<char,_const_char_&> _kjCondition_69;
  undefined1 local_f20 [5];
  bool _kj_shouldLog_63;
  DebugComparison<char,_const_char_&> _kjCondition_68;
  undefined1 local_ef0 [5];
  bool _kj_shouldLog_62;
  DebugComparison<char,_const_char_&> _kjCondition_67;
  undefined1 local_ec0 [5];
  bool _kj_shouldLog_61;
  DebugComparison<char,_const_char_&> _kjCondition_66;
  undefined1 local_e90 [5];
  bool _kj_shouldLog_60;
  DebugComparison<char,_const_char_&> _kjCondition_65;
  undefined1 local_e60 [5];
  bool _kj_shouldLog_59;
  DebugComparison<char,_const_char_&> _kjCondition_64;
  undefined1 local_e30 [5];
  bool _kj_shouldLog_58;
  DebugComparison<char,_const_char_&> _kjCondition_63;
  undefined1 local_e00 [5];
  bool _kj_shouldLog_57;
  DebugComparison<char,_const_char_&> _kjCondition_62;
  undefined1 local_dd0 [5];
  bool _kj_shouldLog_56;
  DebugComparison<char,_const_char_&> _kjCondition_61;
  undefined1 local_da0 [5];
  bool _kj_shouldLog_55;
  DebugComparison<char,_const_char_&> _kjCondition_60;
  undefined1 local_d70 [5];
  bool _kj_shouldLog_54;
  DebugComparison<char,_const_char_&> _kjCondition_59;
  undefined1 local_d40 [5];
  bool _kj_shouldLog_53;
  DebugComparison<char,_const_char_&> _kjCondition_58;
  undefined1 local_d10 [5];
  bool _kj_shouldLog_52;
  DebugComparison<char,_const_char_&> _kjCondition_57;
  undefined1 local_ce0 [5];
  bool _kj_shouldLog_51;
  DebugComparison<char,_const_char_&> _kjCondition_56;
  undefined1 local_cb0 [5];
  bool _kj_shouldLog_50;
  DebugComparison<char,_const_char_&> _kjCondition_55;
  int local_c7c;
  Fault local_c78;
  Fault f_4;
  int local_c68;
  DebugExpression<int> local_c64;
  undefined1 local_c60 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_54;
  ArrayPtr<const_char> chars_1;
  uint local_c20;
  DebugExpression<unsigned_int> DStack_c1c;
  bool _kj_shouldLog_49;
  undefined1 local_c18 [8];
  DebugComparison<unsigned_int,_const_unsigned_char_&> _kjCondition_53;
  uint local_be8;
  DebugExpression<unsigned_int> DStack_be4;
  bool _kj_shouldLog_48;
  undefined1 local_be0 [8];
  DebugComparison<unsigned_int,_const_unsigned_char_&> _kjCondition_52;
  uint local_bb0;
  DebugExpression<unsigned_int> DStack_bac;
  bool _kj_shouldLog_47;
  undefined1 local_ba8 [8];
  DebugComparison<unsigned_int,_const_unsigned_char_&> _kjCondition_51;
  uint local_b78;
  DebugExpression<unsigned_int> DStack_b74;
  bool _kj_shouldLog_46;
  undefined1 local_b70 [8];
  DebugComparison<unsigned_int,_const_unsigned_char_&> _kjCondition_50;
  uint local_b40;
  DebugExpression<unsigned_int> DStack_b3c;
  bool _kj_shouldLog_45;
  undefined1 local_b38 [8];
  DebugComparison<unsigned_int,_const_unsigned_char_&> _kjCondition_49;
  uint local_b08;
  DebugExpression<unsigned_int> DStack_b04;
  bool _kj_shouldLog_44;
  undefined1 local_b00 [8];
  DebugComparison<unsigned_int,_const_unsigned_char_&> _kjCondition_48;
  uint local_ad0;
  DebugExpression<unsigned_int> DStack_acc;
  bool _kj_shouldLog_43;
  undefined1 local_ac8 [8];
  DebugComparison<unsigned_int,_const_unsigned_char_&> _kjCondition_47;
  uint local_a98;
  DebugExpression<unsigned_int> DStack_a94;
  bool _kj_shouldLog_42;
  undefined1 local_a90 [8];
  DebugComparison<unsigned_int,_const_unsigned_char_&> _kjCondition_46;
  uint local_a60;
  DebugExpression<unsigned_int> DStack_a5c;
  bool _kj_shouldLog_41;
  undefined1 local_a58 [8];
  DebugComparison<unsigned_int,_const_unsigned_char_&> _kjCondition_45;
  uint local_a28;
  DebugExpression<unsigned_int> DStack_a24;
  bool _kj_shouldLog_40;
  undefined1 local_a20 [8];
  DebugComparison<unsigned_int,_const_unsigned_char_&> _kjCondition_44;
  uint local_9f0;
  DebugExpression<unsigned_int> DStack_9ec;
  bool _kj_shouldLog_39;
  undefined1 local_9e8 [8];
  DebugComparison<unsigned_int,_const_unsigned_char_&> _kjCondition_43;
  uint local_9b8;
  DebugExpression<unsigned_int> DStack_9b4;
  bool _kj_shouldLog_38;
  undefined1 local_9b0 [8];
  DebugComparison<unsigned_int,_const_unsigned_char_&> _kjCondition_42;
  uint local_980;
  DebugExpression<unsigned_int> DStack_97c;
  bool _kj_shouldLog_37;
  undefined1 local_978 [8];
  DebugComparison<unsigned_int,_const_unsigned_char_&> _kjCondition_41;
  uint local_948;
  DebugExpression<unsigned_int> DStack_944;
  bool _kj_shouldLog_36;
  undefined1 local_940 [8];
  DebugComparison<unsigned_int,_const_unsigned_char_&> _kjCondition_40;
  uint local_910;
  DebugExpression<unsigned_int> DStack_90c;
  bool _kj_shouldLog_35;
  undefined1 local_908 [8];
  DebugComparison<unsigned_int,_const_unsigned_char_&> _kjCondition_39;
  uint local_8d8;
  DebugExpression<unsigned_int> DStack_8d4;
  bool _kj_shouldLog_34;
  undefined1 local_8d0 [8];
  DebugComparison<unsigned_int,_const_unsigned_char_&> _kjCondition_38;
  int local_89c;
  Fault local_898;
  Fault f_3;
  int local_888;
  DebugExpression<int> local_884;
  undefined1 local_880 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_37;
  ArrayPtr<const_unsigned_char> bytes_1;
  ArrayPtr<const_unsigned_int> constArray;
  undefined1 local_830 [5];
  bool _kj_shouldLog_33;
  DebugComparison<char,_char_&> _kjCondition_36;
  undefined1 local_800 [5];
  bool _kj_shouldLog_32;
  DebugComparison<char,_char_&> _kjCondition_35;
  undefined1 local_7d0 [5];
  bool _kj_shouldLog_31;
  DebugComparison<char,_char_&> _kjCondition_34;
  undefined1 local_7a0 [5];
  bool _kj_shouldLog_30;
  DebugComparison<char,_char_&> _kjCondition_33;
  undefined1 local_770 [5];
  bool _kj_shouldLog_29;
  DebugComparison<char,_char_&> _kjCondition_32;
  undefined1 local_740 [5];
  bool _kj_shouldLog_28;
  DebugComparison<char,_char_&> _kjCondition_31;
  undefined1 local_710 [5];
  bool _kj_shouldLog_27;
  DebugComparison<char,_char_&> _kjCondition_30;
  undefined1 local_6e0 [5];
  bool _kj_shouldLog_26;
  DebugComparison<char,_char_&> _kjCondition_29;
  undefined1 local_6b0 [5];
  bool _kj_shouldLog_25;
  DebugComparison<char,_char_&> _kjCondition_28;
  undefined1 local_680 [5];
  bool _kj_shouldLog_24;
  DebugComparison<char,_char_&> _kjCondition_27;
  undefined1 local_650 [5];
  bool _kj_shouldLog_23;
  DebugComparison<char,_char_&> _kjCondition_26;
  undefined1 local_620 [5];
  bool _kj_shouldLog_22;
  DebugComparison<char,_char_&> _kjCondition_25;
  undefined1 local_5f0 [5];
  bool _kj_shouldLog_21;
  DebugComparison<char,_char_&> _kjCondition_24;
  undefined1 local_5c0 [5];
  bool _kj_shouldLog_20;
  DebugComparison<char,_char_&> _kjCondition_23;
  undefined1 local_590 [5];
  bool _kj_shouldLog_19;
  DebugComparison<char,_char_&> _kjCondition_22;
  undefined1 local_560 [5];
  bool _kj_shouldLog_18;
  DebugComparison<char,_char_&> _kjCondition_21;
  int local_52c;
  Fault local_528;
  Fault f_2;
  int local_518;
  DebugExpression<int> local_514;
  undefined1 local_510 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_20;
  ArrayPtr<char> chars;
  uint local_4d0;
  DebugExpression<unsigned_int> DStack_4cc;
  bool _kj_shouldLog_17;
  undefined1 local_4c8 [8];
  DebugComparison<unsigned_int,_unsigned_char_&> _kjCondition_19;
  uint local_498;
  DebugExpression<unsigned_int> DStack_494;
  bool _kj_shouldLog_16;
  undefined1 local_490 [8];
  DebugComparison<unsigned_int,_unsigned_char_&> _kjCondition_18;
  uint local_460;
  DebugExpression<unsigned_int> DStack_45c;
  bool _kj_shouldLog_15;
  undefined1 local_458 [8];
  DebugComparison<unsigned_int,_unsigned_char_&> _kjCondition_17;
  uint local_428;
  DebugExpression<unsigned_int> DStack_424;
  bool _kj_shouldLog_14;
  undefined1 local_420 [8];
  DebugComparison<unsigned_int,_unsigned_char_&> _kjCondition_16;
  uint local_3f0;
  DebugExpression<unsigned_int> DStack_3ec;
  bool _kj_shouldLog_13;
  undefined1 local_3e8 [8];
  DebugComparison<unsigned_int,_unsigned_char_&> _kjCondition_15;
  uint local_3b8;
  DebugExpression<unsigned_int> DStack_3b4;
  bool _kj_shouldLog_12;
  undefined1 local_3b0 [8];
  DebugComparison<unsigned_int,_unsigned_char_&> _kjCondition_14;
  uint local_380;
  DebugExpression<unsigned_int> DStack_37c;
  bool _kj_shouldLog_11;
  undefined1 local_378 [8];
  DebugComparison<unsigned_int,_unsigned_char_&> _kjCondition_13;
  uint local_348;
  DebugExpression<unsigned_int> DStack_344;
  bool _kj_shouldLog_10;
  undefined1 local_340 [8];
  DebugComparison<unsigned_int,_unsigned_char_&> _kjCondition_12;
  uint local_310;
  DebugExpression<unsigned_int> DStack_30c;
  bool _kj_shouldLog_9;
  undefined1 local_308 [8];
  DebugComparison<unsigned_int,_unsigned_char_&> _kjCondition_11;
  uint local_2d8;
  DebugExpression<unsigned_int> DStack_2d4;
  bool _kj_shouldLog_8;
  undefined1 local_2d0 [8];
  DebugComparison<unsigned_int,_unsigned_char_&> _kjCondition_10;
  uint local_2a0;
  DebugExpression<unsigned_int> DStack_29c;
  bool _kj_shouldLog_7;
  undefined1 local_298 [8];
  DebugComparison<unsigned_int,_unsigned_char_&> _kjCondition_9;
  uint local_268;
  DebugExpression<unsigned_int> DStack_264;
  bool _kj_shouldLog_6;
  undefined1 local_260 [8];
  DebugComparison<unsigned_int,_unsigned_char_&> _kjCondition_8;
  uint local_230;
  DebugExpression<unsigned_int> DStack_22c;
  bool _kj_shouldLog_5;
  undefined1 local_228 [8];
  DebugComparison<unsigned_int,_unsigned_char_&> _kjCondition_7;
  uint local_1f8;
  DebugExpression<unsigned_int> DStack_1f4;
  bool _kj_shouldLog_4;
  undefined1 local_1f0 [8];
  DebugComparison<unsigned_int,_unsigned_char_&> _kjCondition_6;
  uint local_1c0;
  DebugExpression<unsigned_int> DStack_1bc;
  bool _kj_shouldLog_3;
  undefined1 local_1b8 [8];
  DebugComparison<unsigned_int,_unsigned_char_&> _kjCondition_5;
  uint local_188;
  DebugExpression<unsigned_int> DStack_184;
  bool _kj_shouldLog_2;
  undefined1 local_180 [8];
  DebugComparison<unsigned_int,_unsigned_char_&> _kjCondition_4;
  int local_14c;
  Fault local_148;
  Fault f_1;
  int local_138;
  DebugExpression<int> local_134;
  undefined1 local_130 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_3;
  ArrayPtr<unsigned_char> bytes;
  uint local_f0;
  DebugExpression<unsigned_int> DStack_ec;
  bool _kj_shouldLog_1;
  undefined1 local_e8 [8];
  DebugComparison<unsigned_int,_unsigned_int_&> _kjCondition_2;
  uint local_b8;
  DebugExpression<unsigned_int> DStack_b4;
  bool _kj_shouldLog;
  undefined1 local_b0 [8];
  DebugComparison<unsigned_int,_unsigned_int_&> _kjCondition_1;
  size_t local_78;
  int local_6c;
  Fault local_68;
  Fault f;
  int local_58;
  DebugExpression<int> local_54;
  undefined1 local_50 [8];
  DebugComparison<int,_unsigned_long> _kjCondition;
  ArrayPtr<unsigned_int> array;
  uint32_t raw [2];
  TestCase697 *this_local;
  
  array.size_ = 0x9abcdef012345678;
  ArrayPtr<unsigned_int>::ArrayPtr<2ul>
            ((ArrayPtr<unsigned_int> *)&_kjCondition.result,(uint (*) [2])&array.size_);
  local_58 = 2;
  local_54 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_58);
  f.exception = (Exception *)
                ArrayPtr<unsigned_int>::size((ArrayPtr<unsigned_int> *)&_kjCondition.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_50,&local_54,(unsigned_long *)&f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (!bVar1) {
    local_6c = 2;
    local_78 = ArrayPtr<unsigned_int>::size((ArrayPtr<unsigned_int> *)&_kjCondition.result);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x2bd,FAILED,"(2) == (array.size())","_kjCondition,2, array.size()",
               (DebugComparison<int,_unsigned_long> *)local_50,&local_6c,&local_78);
    kj::_::Debug::Fault::fatal(&local_68);
  }
  local_b8 = 0x12345678;
  DStack_b4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_b8);
  puVar2 = ArrayPtr<unsigned_int>::operator[]((ArrayPtr<unsigned_int> *)&_kjCondition.result,0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int_&> *)local_b0,&stack0xffffffffffffff4c,
             puVar2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b0);
  if (!bVar1) {
    _kjCondition_2._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._39_1_ != '\0') {
      _kjCondition_2.result = true;
      _kjCondition_2._33_3_ = 0x123456;
      puVar2 = ArrayPtr<unsigned_int>::operator[]((ArrayPtr<unsigned_int> *)&_kjCondition.result,0);
      kj::_::Debug::
      log<char_const(&)[45],kj::_::DebugComparison<unsigned_int,unsigned_int&>&,unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x2be,ERROR,
                 "\"failed: expected \" \"(0x12345678u) == (array[0])\", _kjCondition, 0x12345678u, array[0]"
                 ,(char (*) [45])"failed: expected (0x12345678u) == (array[0])",
                 (DebugComparison<unsigned_int,_unsigned_int_&> *)local_b0,
                 (uint *)&_kjCondition_2.result,puVar2);
      _kjCondition_2._39_1_ = 0;
    }
  }
  local_f0 = 0x9abcdef0;
  DStack_ec = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_f0);
  puVar2 = ArrayPtr<unsigned_int>::operator[]((ArrayPtr<unsigned_int> *)&_kjCondition.result,1);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int_&> *)local_e8,&stack0xffffffffffffff14,
             puVar2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e8);
  if (!bVar1) {
    bytes.size_._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)bytes.size_._7_1_ != false) {
      bytes.size_._0_4_ = 0x9abcdef0;
      puVar2 = ArrayPtr<unsigned_int>::operator[]((ArrayPtr<unsigned_int> *)&_kjCondition.result,1);
      kj::_::Debug::
      log<char_const(&)[45],kj::_::DebugComparison<unsigned_int,unsigned_int&>&,unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x2bf,ERROR,
                 "\"failed: expected \" \"(0x9abcdef0u) == (array[1])\", _kjCondition, 0x9abcdef0u, array[1]"
                 ,(char (*) [45])"failed: expected (0x9abcdef0u) == (array[1])",
                 (DebugComparison<unsigned_int,_unsigned_int_&> *)local_e8,(uint *)&bytes.size_,
                 puVar2);
      bytes.size_._7_1_ = false;
    }
  }
  join_0x00000010_0x00000000_ =
       ArrayPtr<unsigned_int>::asBytes((ArrayPtr<unsigned_int> *)&_kjCondition.result);
  local_138 = 8;
  local_134 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_138);
  f_1.exception =
       (Exception *)ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&_kjCondition_3.result)
  ;
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_130,&local_134,(unsigned_long *)&f_1);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_130);
  if (!bVar1) {
    local_14c = 8;
    _kjCondition_4._32_8_ =
         ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&_kjCondition_3.result);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              (&local_148,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x2c3,FAILED,"(8) == (bytes.size())","_kjCondition,8, bytes.size()",
               (DebugComparison<int,_unsigned_long> *)local_130,&local_14c,
               (unsigned_long *)&_kjCondition_4.result);
    kj::_::Debug::Fault::fatal(&local_148);
  }
  puVar3 = ArrayPtr<unsigned_char>::operator[]((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,0);
  if (*puVar3 == '\x12') {
    local_188 = 0x12;
    DStack_184 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_188);
    puVar3 = ArrayPtr<unsigned_char>::operator[]
                       ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,0);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_char_&> *)local_180,&stack0xfffffffffffffe7c,
               puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_180);
    if (!bVar1) {
      _kjCondition_5._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_5._39_1_ != '\0') {
        _kjCondition_5.result = true;
        _kjCondition_5._33_3_ = 0;
        puVar3 = ArrayPtr<unsigned_char>::operator[]
                           ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,0);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char&>&,unsigned_int,unsigned_char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2c7,ERROR,
                   "\"failed: expected \" \"(0x12u) == (bytes[0])\", _kjCondition, 0x12u, bytes[0]",
                   (char (*) [39])"failed: expected (0x12u) == (bytes[0])",
                   (DebugComparison<unsigned_int,_unsigned_char_&> *)local_180,
                   (uint *)&_kjCondition_5.result,puVar3);
        _kjCondition_5._39_1_ = 0;
      }
    }
    local_1c0 = 0x34;
    DStack_1bc = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1c0);
    puVar3 = ArrayPtr<unsigned_char>::operator[]
                       ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,1);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_char_&> *)local_1b8,&stack0xfffffffffffffe44,
               puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1b8);
    if (!bVar1) {
      _kjCondition_6._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_6._39_1_ != '\0') {
        _kjCondition_6.result = true;
        _kjCondition_6._33_3_ = 0;
        puVar3 = ArrayPtr<unsigned_char>::operator[]
                           ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,1);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char&>&,unsigned_int,unsigned_char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2c8,ERROR,
                   "\"failed: expected \" \"(0x34u) == (bytes[1])\", _kjCondition, 0x34u, bytes[1]",
                   (char (*) [39])"failed: expected (0x34u) == (bytes[1])",
                   (DebugComparison<unsigned_int,_unsigned_char_&> *)local_1b8,
                   (uint *)&_kjCondition_6.result,puVar3);
        _kjCondition_6._39_1_ = 0;
      }
    }
    local_1f8 = 0x56;
    DStack_1f4 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1f8);
    puVar3 = ArrayPtr<unsigned_char>::operator[]
                       ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,2);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_char_&> *)local_1f0,&stack0xfffffffffffffe0c,
               puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1f0);
    if (!bVar1) {
      _kjCondition_7._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_7._39_1_ != '\0') {
        _kjCondition_7.result = true;
        _kjCondition_7._33_3_ = 0;
        puVar3 = ArrayPtr<unsigned_char>::operator[]
                           ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,2);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char&>&,unsigned_int,unsigned_char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2c9,ERROR,
                   "\"failed: expected \" \"(0x56u) == (bytes[2])\", _kjCondition, 0x56u, bytes[2]",
                   (char (*) [39])"failed: expected (0x56u) == (bytes[2])",
                   (DebugComparison<unsigned_int,_unsigned_char_&> *)local_1f0,
                   (uint *)&_kjCondition_7.result,puVar3);
        _kjCondition_7._39_1_ = 0;
      }
    }
    local_230 = 0x78;
    DStack_22c = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_230);
    puVar3 = ArrayPtr<unsigned_char>::operator[]
                       ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,3);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_char_&> *)local_228,&stack0xfffffffffffffdd4,
               puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_228);
    if (!bVar1) {
      _kjCondition_8._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_8._39_1_ != '\0') {
        _kjCondition_8.result = true;
        _kjCondition_8._33_3_ = 0;
        puVar3 = ArrayPtr<unsigned_char>::operator[]
                           ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,3);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char&>&,unsigned_int,unsigned_char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2ca,ERROR,
                   "\"failed: expected \" \"(0x78u) == (bytes[3])\", _kjCondition, 0x78u, bytes[3]",
                   (char (*) [39])"failed: expected (0x78u) == (bytes[3])",
                   (DebugComparison<unsigned_int,_unsigned_char_&> *)local_228,
                   (uint *)&_kjCondition_8.result,puVar3);
        _kjCondition_8._39_1_ = 0;
      }
    }
    local_268 = 0x9a;
    DStack_264 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_268);
    puVar3 = ArrayPtr<unsigned_char>::operator[]
                       ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,4);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_char_&> *)local_260,&stack0xfffffffffffffd9c,
               puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_260);
    if (!bVar1) {
      _kjCondition_9._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_9._39_1_ != '\0') {
        _kjCondition_9.result = true;
        _kjCondition_9._33_3_ = 0;
        puVar3 = ArrayPtr<unsigned_char>::operator[]
                           ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,4);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char&>&,unsigned_int,unsigned_char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2cb,ERROR,
                   "\"failed: expected \" \"(0x9au) == (bytes[4])\", _kjCondition, 0x9au, bytes[4]",
                   (char (*) [39])"failed: expected (0x9au) == (bytes[4])",
                   (DebugComparison<unsigned_int,_unsigned_char_&> *)local_260,
                   (uint *)&_kjCondition_9.result,puVar3);
        _kjCondition_9._39_1_ = 0;
      }
    }
    local_2a0 = 0xbc;
    DStack_29c = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2a0);
    puVar3 = ArrayPtr<unsigned_char>::operator[]
                       ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,5);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_char_&> *)local_298,&stack0xfffffffffffffd64,
               puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_298);
    if (!bVar1) {
      _kjCondition_10._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_10._39_1_ != '\0') {
        _kjCondition_10.result = true;
        _kjCondition_10._33_3_ = 0;
        puVar3 = ArrayPtr<unsigned_char>::operator[]
                           ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,5);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char&>&,unsigned_int,unsigned_char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2cc,ERROR,
                   "\"failed: expected \" \"(0xbcu) == (bytes[5])\", _kjCondition, 0xbcu, bytes[5]",
                   (char (*) [39])"failed: expected (0xbcu) == (bytes[5])",
                   (DebugComparison<unsigned_int,_unsigned_char_&> *)local_298,
                   (uint *)&_kjCondition_10.result,puVar3);
        _kjCondition_10._39_1_ = 0;
      }
    }
    local_2d8 = 0xde;
    DStack_2d4 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2d8);
    puVar3 = ArrayPtr<unsigned_char>::operator[]
                       ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,6);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_char_&> *)local_2d0,&stack0xfffffffffffffd2c,
               puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2d0);
    if (!bVar1) {
      _kjCondition_11._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_11._39_1_ != '\0') {
        _kjCondition_11.result = true;
        _kjCondition_11._33_3_ = 0;
        puVar3 = ArrayPtr<unsigned_char>::operator[]
                           ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,6);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char&>&,unsigned_int,unsigned_char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2cd,ERROR,
                   "\"failed: expected \" \"(0xdeu) == (bytes[6])\", _kjCondition, 0xdeu, bytes[6]",
                   (char (*) [39])"failed: expected (0xdeu) == (bytes[6])",
                   (DebugComparison<unsigned_int,_unsigned_char_&> *)local_2d0,
                   (uint *)&_kjCondition_11.result,puVar3);
        _kjCondition_11._39_1_ = 0;
      }
    }
    local_310 = 0xf0;
    DStack_30c = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_310);
    puVar3 = ArrayPtr<unsigned_char>::operator[]
                       ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,7);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_char_&> *)local_308,&stack0xfffffffffffffcf4,
               puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_308);
    if (!bVar1) {
      _kjCondition_12._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_12._39_1_ != '\0') {
        _kjCondition_12.result = true;
        _kjCondition_12._33_3_ = 0;
        puVar3 = ArrayPtr<unsigned_char>::operator[]
                           ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,7);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char&>&,unsigned_int,unsigned_char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2ce,ERROR,
                   "\"failed: expected \" \"(0xf0u) == (bytes[7])\", _kjCondition, 0xf0u, bytes[7]",
                   (char (*) [39])"failed: expected (0xf0u) == (bytes[7])",
                   (DebugComparison<unsigned_int,_unsigned_char_&> *)local_308,
                   (uint *)&_kjCondition_12.result,puVar3);
        _kjCondition_12._39_1_ = 0;
      }
    }
  }
  else {
    local_348 = 0x12;
    DStack_344 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_348);
    puVar3 = ArrayPtr<unsigned_char>::operator[]
                       ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,3);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_char_&> *)local_340,&stack0xfffffffffffffcbc,
               puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_340);
    if (!bVar1) {
      _kjCondition_13._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_13._39_1_ != '\0') {
        _kjCondition_13.result = true;
        _kjCondition_13._33_3_ = 0;
        puVar3 = ArrayPtr<unsigned_char>::operator[]
                           ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,3);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char&>&,unsigned_int,unsigned_char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2d1,ERROR,
                   "\"failed: expected \" \"(0x12u) == (bytes[3])\", _kjCondition, 0x12u, bytes[3]",
                   (char (*) [39])"failed: expected (0x12u) == (bytes[3])",
                   (DebugComparison<unsigned_int,_unsigned_char_&> *)local_340,
                   (uint *)&_kjCondition_13.result,puVar3);
        _kjCondition_13._39_1_ = 0;
      }
    }
    local_380 = 0x34;
    DStack_37c = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_380);
    puVar3 = ArrayPtr<unsigned_char>::operator[]
                       ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,2);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_char_&> *)local_378,&stack0xfffffffffffffc84,
               puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_378);
    if (!bVar1) {
      _kjCondition_14._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_14._39_1_ != '\0') {
        _kjCondition_14.result = true;
        _kjCondition_14._33_3_ = 0;
        puVar3 = ArrayPtr<unsigned_char>::operator[]
                           ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,2);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char&>&,unsigned_int,unsigned_char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2d2,ERROR,
                   "\"failed: expected \" \"(0x34u) == (bytes[2])\", _kjCondition, 0x34u, bytes[2]",
                   (char (*) [39])"failed: expected (0x34u) == (bytes[2])",
                   (DebugComparison<unsigned_int,_unsigned_char_&> *)local_378,
                   (uint *)&_kjCondition_14.result,puVar3);
        _kjCondition_14._39_1_ = 0;
      }
    }
    local_3b8 = 0x56;
    DStack_3b4 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3b8);
    puVar3 = ArrayPtr<unsigned_char>::operator[]
                       ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,1);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_char_&> *)local_3b0,&stack0xfffffffffffffc4c,
               puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3b0);
    if (!bVar1) {
      _kjCondition_15._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_15._39_1_ != '\0') {
        _kjCondition_15.result = true;
        _kjCondition_15._33_3_ = 0;
        puVar3 = ArrayPtr<unsigned_char>::operator[]
                           ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,1);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char&>&,unsigned_int,unsigned_char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2d3,ERROR,
                   "\"failed: expected \" \"(0x56u) == (bytes[1])\", _kjCondition, 0x56u, bytes[1]",
                   (char (*) [39])"failed: expected (0x56u) == (bytes[1])",
                   (DebugComparison<unsigned_int,_unsigned_char_&> *)local_3b0,
                   (uint *)&_kjCondition_15.result,puVar3);
        _kjCondition_15._39_1_ = 0;
      }
    }
    local_3f0 = 0x78;
    DStack_3ec = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3f0);
    puVar3 = ArrayPtr<unsigned_char>::operator[]
                       ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,0);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_char_&> *)local_3e8,&stack0xfffffffffffffc14,
               puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3e8);
    if (!bVar1) {
      _kjCondition_16._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_16._39_1_ != '\0') {
        _kjCondition_16.result = true;
        _kjCondition_16._33_3_ = 0;
        puVar3 = ArrayPtr<unsigned_char>::operator[]
                           ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,0);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char&>&,unsigned_int,unsigned_char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2d4,ERROR,
                   "\"failed: expected \" \"(0x78u) == (bytes[0])\", _kjCondition, 0x78u, bytes[0]",
                   (char (*) [39])"failed: expected (0x78u) == (bytes[0])",
                   (DebugComparison<unsigned_int,_unsigned_char_&> *)local_3e8,
                   (uint *)&_kjCondition_16.result,puVar3);
        _kjCondition_16._39_1_ = 0;
      }
    }
    local_428 = 0x9a;
    DStack_424 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_428);
    puVar3 = ArrayPtr<unsigned_char>::operator[]
                       ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,7);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_char_&> *)local_420,&stack0xfffffffffffffbdc,
               puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_420);
    if (!bVar1) {
      _kjCondition_17._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_17._39_1_ != '\0') {
        _kjCondition_17.result = true;
        _kjCondition_17._33_3_ = 0;
        puVar3 = ArrayPtr<unsigned_char>::operator[]
                           ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,7);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char&>&,unsigned_int,unsigned_char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2d5,ERROR,
                   "\"failed: expected \" \"(0x9au) == (bytes[7])\", _kjCondition, 0x9au, bytes[7]",
                   (char (*) [39])"failed: expected (0x9au) == (bytes[7])",
                   (DebugComparison<unsigned_int,_unsigned_char_&> *)local_420,
                   (uint *)&_kjCondition_17.result,puVar3);
        _kjCondition_17._39_1_ = 0;
      }
    }
    local_460 = 0xbc;
    DStack_45c = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_460);
    puVar3 = ArrayPtr<unsigned_char>::operator[]
                       ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,6);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_char_&> *)local_458,&stack0xfffffffffffffba4,
               puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_458);
    if (!bVar1) {
      _kjCondition_18._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_18._39_1_ != '\0') {
        _kjCondition_18.result = true;
        _kjCondition_18._33_3_ = 0;
        puVar3 = ArrayPtr<unsigned_char>::operator[]
                           ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,6);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char&>&,unsigned_int,unsigned_char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2d6,ERROR,
                   "\"failed: expected \" \"(0xbcu) == (bytes[6])\", _kjCondition, 0xbcu, bytes[6]",
                   (char (*) [39])"failed: expected (0xbcu) == (bytes[6])",
                   (DebugComparison<unsigned_int,_unsigned_char_&> *)local_458,
                   (uint *)&_kjCondition_18.result,puVar3);
        _kjCondition_18._39_1_ = 0;
      }
    }
    local_498 = 0xde;
    DStack_494 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_498);
    puVar3 = ArrayPtr<unsigned_char>::operator[]
                       ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,5);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_char_&> *)local_490,&stack0xfffffffffffffb6c,
               puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_490);
    if (!bVar1) {
      _kjCondition_19._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_19._39_1_ != '\0') {
        _kjCondition_19.result = true;
        _kjCondition_19._33_3_ = 0;
        puVar3 = ArrayPtr<unsigned_char>::operator[]
                           ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,5);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char&>&,unsigned_int,unsigned_char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2d7,ERROR,
                   "\"failed: expected \" \"(0xdeu) == (bytes[5])\", _kjCondition, 0xdeu, bytes[5]",
                   (char (*) [39])"failed: expected (0xdeu) == (bytes[5])",
                   (DebugComparison<unsigned_int,_unsigned_char_&> *)local_490,
                   (uint *)&_kjCondition_19.result,puVar3);
        _kjCondition_19._39_1_ = 0;
      }
    }
    local_4d0 = 0xf0;
    DStack_4cc = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_4d0);
    puVar3 = ArrayPtr<unsigned_char>::operator[]
                       ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,4);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_char_&> *)local_4c8,&stack0xfffffffffffffb34,
               puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_4c8);
    if (!bVar1) {
      chars.size_._7_1_ = kj::_::Debug::shouldLog(ERROR);
      while ((bool)chars.size_._7_1_ != false) {
        chars.size_._0_4_ = 0xf0;
        puVar3 = ArrayPtr<unsigned_char>::operator[]
                           ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,4);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char&>&,unsigned_int,unsigned_char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2d8,ERROR,
                   "\"failed: expected \" \"(0xf0u) == (bytes[4])\", _kjCondition, 0xf0u, bytes[4]",
                   (char (*) [39])"failed: expected (0xf0u) == (bytes[4])",
                   (DebugComparison<unsigned_int,_unsigned_char_&> *)local_4c8,(uint *)&chars.size_,
                   puVar3);
        chars.size_._7_1_ = false;
      }
    }
  }
  join_0x00000010_0x00000000_ =
       ArrayPtr<unsigned_int>::asChars((ArrayPtr<unsigned_int> *)&_kjCondition.result);
  local_518 = 8;
  local_514 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_518);
  f_2.exception = (Exception *)ArrayPtr<char>::size((ArrayPtr<char> *)&_kjCondition_20.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_510,&local_514,(unsigned_long *)&f_2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_510);
  if (!bVar1) {
    local_52c = 8;
    _kjCondition_21._32_8_ = ArrayPtr<char>::size((ArrayPtr<char> *)&_kjCondition_20.result);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              (&local_528,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x2de,FAILED,"(8) == (chars.size())","_kjCondition,8, chars.size()",
               (DebugComparison<int,_unsigned_long> *)local_510,&local_52c,
               (unsigned_long *)&_kjCondition_21.result);
    kj::_::Debug::Fault::fatal(&local_528);
  }
  pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,0);
  if (*pcVar4 == '\x12') {
    _kjCondition_22._38_1_ = 0x12;
    _kjCondition_22._39_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_22.field_0x26);
    pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,0);
    kj::_::DebugExpression<char>::operator==
              ((DebugComparison<char,_char_&> *)local_560,
               (DebugExpression<char> *)&_kjCondition_22.field_0x27,pcVar4);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_560);
    if (!bVar1) {
      _kjCondition_22._37_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_22._37_1_ != '\0') {
        _kjCondition_22._36_1_ = 0x12;
        pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,0);
        kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<char,char&>&,char,char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2e2,ERROR,
                   "\"failed: expected \" \"(\'\\\\x12\') == (chars[0])\", _kjCondition, \'\\x12\', chars[0]"
                   ,(char (*) [40])"failed: expected (\'\\x12\') == (chars[0])",
                   (DebugComparison<char,_char_&> *)local_560,&_kjCondition_22.field_0x24,pcVar4);
        _kjCondition_22._37_1_ = 0;
      }
    }
    _kjCondition_23._38_1_ = 0x34;
    _kjCondition_23._39_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_23.field_0x26);
    pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,1);
    kj::_::DebugExpression<char>::operator==
              ((DebugComparison<char,_char_&> *)local_590,
               (DebugExpression<char> *)&_kjCondition_23.field_0x27,pcVar4);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_590);
    if (!bVar1) {
      _kjCondition_23._37_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_23._37_1_ != '\0') {
        _kjCondition_23._36_1_ = 0x34;
        pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,1);
        kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<char,char&>&,char,char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2e3,ERROR,
                   "\"failed: expected \" \"(\'\\\\x34\') == (chars[1])\", _kjCondition, \'\\x34\', chars[1]"
                   ,(char (*) [40])"failed: expected (\'\\x34\') == (chars[1])",
                   (DebugComparison<char,_char_&> *)local_590,&_kjCondition_23.field_0x24,pcVar4);
        _kjCondition_23._37_1_ = 0;
      }
    }
    _kjCondition_24._38_1_ = 0x56;
    _kjCondition_24._39_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_24.field_0x26);
    pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,2);
    kj::_::DebugExpression<char>::operator==
              ((DebugComparison<char,_char_&> *)local_5c0,
               (DebugExpression<char> *)&_kjCondition_24.field_0x27,pcVar4);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_5c0);
    if (!bVar1) {
      _kjCondition_24._37_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_24._37_1_ != '\0') {
        _kjCondition_24._36_1_ = 0x56;
        pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,2);
        kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<char,char&>&,char,char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2e4,ERROR,
                   "\"failed: expected \" \"(\'\\\\x56\') == (chars[2])\", _kjCondition, \'\\x56\', chars[2]"
                   ,(char (*) [40])"failed: expected (\'\\x56\') == (chars[2])",
                   (DebugComparison<char,_char_&> *)local_5c0,&_kjCondition_24.field_0x24,pcVar4);
        _kjCondition_24._37_1_ = 0;
      }
    }
    _kjCondition_25._38_1_ = 0x78;
    _kjCondition_25._39_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_25.field_0x26);
    pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,3);
    kj::_::DebugExpression<char>::operator==
              ((DebugComparison<char,_char_&> *)local_5f0,
               (DebugExpression<char> *)&_kjCondition_25.field_0x27,pcVar4);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_5f0);
    if (!bVar1) {
      _kjCondition_25._37_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_25._37_1_ != '\0') {
        _kjCondition_25._36_1_ = 0x78;
        pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,3);
        kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<char,char&>&,char,char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2e5,ERROR,
                   "\"failed: expected \" \"(\'\\\\x78\') == (chars[3])\", _kjCondition, \'\\x78\', chars[3]"
                   ,(char (*) [40])"failed: expected (\'\\x78\') == (chars[3])",
                   (DebugComparison<char,_char_&> *)local_5f0,&_kjCondition_25.field_0x24,pcVar4);
        _kjCondition_25._37_1_ = 0;
      }
    }
    _kjCondition_26._38_1_ = 0x9a;
    _kjCondition_26._39_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_26.field_0x26);
    pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,4);
    kj::_::DebugExpression<char>::operator==
              ((DebugComparison<char,_char_&> *)local_620,
               (DebugExpression<char> *)&_kjCondition_26.field_0x27,pcVar4);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_620);
    if (!bVar1) {
      _kjCondition_26._37_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_26._37_1_ != '\0') {
        _kjCondition_26._36_1_ = 0x9a;
        pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,4);
        kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<char,char&>&,char,char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2e6,ERROR,
                   "\"failed: expected \" \"(\'\\\\x9a\') == (chars[4])\", _kjCondition, \'\\x9a\', chars[4]"
                   ,(char (*) [40])"failed: expected (\'\\x9a\') == (chars[4])",
                   (DebugComparison<char,_char_&> *)local_620,&_kjCondition_26.field_0x24,pcVar4);
        _kjCondition_26._37_1_ = 0;
      }
    }
    _kjCondition_27._38_1_ = 0xbc;
    _kjCondition_27._39_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_27.field_0x26);
    pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,5);
    kj::_::DebugExpression<char>::operator==
              ((DebugComparison<char,_char_&> *)local_650,
               (DebugExpression<char> *)&_kjCondition_27.field_0x27,pcVar4);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_650);
    if (!bVar1) {
      _kjCondition_27._37_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_27._37_1_ != '\0') {
        _kjCondition_27._36_1_ = 0xbc;
        pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,5);
        kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<char,char&>&,char,char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2e7,ERROR,
                   "\"failed: expected \" \"(\'\\\\xbc\') == (chars[5])\", _kjCondition, \'\\xbc\', chars[5]"
                   ,(char (*) [40])"failed: expected (\'\\xbc\') == (chars[5])",
                   (DebugComparison<char,_char_&> *)local_650,&_kjCondition_27.field_0x24,pcVar4);
        _kjCondition_27._37_1_ = 0;
      }
    }
    _kjCondition_28._38_1_ = 0xde;
    _kjCondition_28._39_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_28.field_0x26);
    pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,6);
    kj::_::DebugExpression<char>::operator==
              ((DebugComparison<char,_char_&> *)local_680,
               (DebugExpression<char> *)&_kjCondition_28.field_0x27,pcVar4);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_680);
    if (!bVar1) {
      _kjCondition_28._37_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_28._37_1_ != '\0') {
        _kjCondition_28._36_1_ = 0xde;
        pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,6);
        kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<char,char&>&,char,char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2e8,ERROR,
                   "\"failed: expected \" \"(\'\\\\xde\') == (chars[6])\", _kjCondition, \'\\xde\', chars[6]"
                   ,(char (*) [40])"failed: expected (\'\\xde\') == (chars[6])",
                   (DebugComparison<char,_char_&> *)local_680,&_kjCondition_28.field_0x24,pcVar4);
        _kjCondition_28._37_1_ = 0;
      }
    }
    _kjCondition_29._38_1_ = 0xf0;
    _kjCondition_29._39_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_29.field_0x26);
    pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,7);
    kj::_::DebugExpression<char>::operator==
              ((DebugComparison<char,_char_&> *)local_6b0,
               (DebugExpression<char> *)&_kjCondition_29.field_0x27,pcVar4);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_6b0);
    if (!bVar1) {
      _kjCondition_29._37_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_29._37_1_ != '\0') {
        _kjCondition_29._36_1_ = 0xf0;
        pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,7);
        kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<char,char&>&,char,char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2e9,ERROR,
                   "\"failed: expected \" \"(\'\\\\xf0\') == (chars[7])\", _kjCondition, \'\\xf0\', chars[7]"
                   ,(char (*) [40])"failed: expected (\'\\xf0\') == (chars[7])",
                   (DebugComparison<char,_char_&> *)local_6b0,&_kjCondition_29.field_0x24,pcVar4);
        _kjCondition_29._37_1_ = 0;
      }
    }
  }
  else {
    _kjCondition_30._38_1_ = 0x12;
    _kjCondition_30._39_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_30.field_0x26);
    pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,3);
    kj::_::DebugExpression<char>::operator==
              ((DebugComparison<char,_char_&> *)local_6e0,
               (DebugExpression<char> *)&_kjCondition_30.field_0x27,pcVar4);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_6e0);
    if (!bVar1) {
      _kjCondition_30._37_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_30._37_1_ != '\0') {
        _kjCondition_30._36_1_ = 0x12;
        pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,3);
        kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<char,char&>&,char,char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2ec,ERROR,
                   "\"failed: expected \" \"(\'\\\\x12\') == (chars[3])\", _kjCondition, \'\\x12\', chars[3]"
                   ,(char (*) [40])"failed: expected (\'\\x12\') == (chars[3])",
                   (DebugComparison<char,_char_&> *)local_6e0,&_kjCondition_30.field_0x24,pcVar4);
        _kjCondition_30._37_1_ = 0;
      }
    }
    _kjCondition_31._38_1_ = 0x34;
    _kjCondition_31._39_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_31.field_0x26);
    pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,2);
    kj::_::DebugExpression<char>::operator==
              ((DebugComparison<char,_char_&> *)local_710,
               (DebugExpression<char> *)&_kjCondition_31.field_0x27,pcVar4);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_710);
    if (!bVar1) {
      _kjCondition_31._37_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_31._37_1_ != '\0') {
        _kjCondition_31._36_1_ = 0x34;
        pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,2);
        kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<char,char&>&,char,char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2ed,ERROR,
                   "\"failed: expected \" \"(\'\\\\x34\') == (chars[2])\", _kjCondition, \'\\x34\', chars[2]"
                   ,(char (*) [40])"failed: expected (\'\\x34\') == (chars[2])",
                   (DebugComparison<char,_char_&> *)local_710,&_kjCondition_31.field_0x24,pcVar4);
        _kjCondition_31._37_1_ = 0;
      }
    }
    _kjCondition_32._38_1_ = 0x56;
    _kjCondition_32._39_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_32.field_0x26);
    pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,1);
    kj::_::DebugExpression<char>::operator==
              ((DebugComparison<char,_char_&> *)local_740,
               (DebugExpression<char> *)&_kjCondition_32.field_0x27,pcVar4);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_740);
    if (!bVar1) {
      _kjCondition_32._37_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_32._37_1_ != '\0') {
        _kjCondition_32._36_1_ = 0x56;
        pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,1);
        kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<char,char&>&,char,char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2ee,ERROR,
                   "\"failed: expected \" \"(\'\\\\x56\') == (chars[1])\", _kjCondition, \'\\x56\', chars[1]"
                   ,(char (*) [40])"failed: expected (\'\\x56\') == (chars[1])",
                   (DebugComparison<char,_char_&> *)local_740,&_kjCondition_32.field_0x24,pcVar4);
        _kjCondition_32._37_1_ = 0;
      }
    }
    _kjCondition_33._38_1_ = 0x78;
    _kjCondition_33._39_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_33.field_0x26);
    pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,0);
    kj::_::DebugExpression<char>::operator==
              ((DebugComparison<char,_char_&> *)local_770,
               (DebugExpression<char> *)&_kjCondition_33.field_0x27,pcVar4);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_770);
    if (!bVar1) {
      _kjCondition_33._37_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_33._37_1_ != '\0') {
        _kjCondition_33._36_1_ = 0x78;
        pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,0);
        kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<char,char&>&,char,char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2ef,ERROR,
                   "\"failed: expected \" \"(\'\\\\x78\') == (chars[0])\", _kjCondition, \'\\x78\', chars[0]"
                   ,(char (*) [40])"failed: expected (\'\\x78\') == (chars[0])",
                   (DebugComparison<char,_char_&> *)local_770,&_kjCondition_33.field_0x24,pcVar4);
        _kjCondition_33._37_1_ = 0;
      }
    }
    _kjCondition_34._38_1_ = 0x9a;
    _kjCondition_34._39_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_34.field_0x26);
    pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,7);
    kj::_::DebugExpression<char>::operator==
              ((DebugComparison<char,_char_&> *)local_7a0,
               (DebugExpression<char> *)&_kjCondition_34.field_0x27,pcVar4);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_7a0);
    if (!bVar1) {
      _kjCondition_34._37_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_34._37_1_ != '\0') {
        _kjCondition_34._36_1_ = 0x9a;
        pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,7);
        kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<char,char&>&,char,char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2f0,ERROR,
                   "\"failed: expected \" \"(\'\\\\x9a\') == (chars[7])\", _kjCondition, \'\\x9a\', chars[7]"
                   ,(char (*) [40])"failed: expected (\'\\x9a\') == (chars[7])",
                   (DebugComparison<char,_char_&> *)local_7a0,&_kjCondition_34.field_0x24,pcVar4);
        _kjCondition_34._37_1_ = 0;
      }
    }
    _kjCondition_35._38_1_ = 0xbc;
    _kjCondition_35._39_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_35.field_0x26);
    pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,6);
    kj::_::DebugExpression<char>::operator==
              ((DebugComparison<char,_char_&> *)local_7d0,
               (DebugExpression<char> *)&_kjCondition_35.field_0x27,pcVar4);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_7d0);
    if (!bVar1) {
      _kjCondition_35._37_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_35._37_1_ != '\0') {
        _kjCondition_35._36_1_ = 0xbc;
        pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,6);
        kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<char,char&>&,char,char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2f1,ERROR,
                   "\"failed: expected \" \"(\'\\\\xbc\') == (chars[6])\", _kjCondition, \'\\xbc\', chars[6]"
                   ,(char (*) [40])"failed: expected (\'\\xbc\') == (chars[6])",
                   (DebugComparison<char,_char_&> *)local_7d0,&_kjCondition_35.field_0x24,pcVar4);
        _kjCondition_35._37_1_ = 0;
      }
    }
    _kjCondition_36._38_1_ = 0xde;
    _kjCondition_36._39_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_36.field_0x26);
    pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,5);
    kj::_::DebugExpression<char>::operator==
              ((DebugComparison<char,_char_&> *)local_800,
               (DebugExpression<char> *)&_kjCondition_36.field_0x27,pcVar4);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_800);
    if (!bVar1) {
      _kjCondition_36._37_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_36._37_1_ != '\0') {
        _kjCondition_36._36_1_ = 0xde;
        pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,5);
        kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<char,char&>&,char,char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2f2,ERROR,
                   "\"failed: expected \" \"(\'\\\\xde\') == (chars[5])\", _kjCondition, \'\\xde\', chars[5]"
                   ,(char (*) [40])"failed: expected (\'\\xde\') == (chars[5])",
                   (DebugComparison<char,_char_&> *)local_800,&_kjCondition_36.field_0x24,pcVar4);
        _kjCondition_36._37_1_ = 0;
      }
    }
    constArray.size_._6_1_ = 0xf0;
    constArray.size_._7_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                    (char *)((long)&constArray.size_ + 6));
    pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,4);
    kj::_::DebugExpression<char>::operator==
              ((DebugComparison<char,_char_&> *)local_830,
               (DebugExpression<char> *)((long)&constArray.size_ + 7),pcVar4);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_830);
    if (!bVar1) {
      constArray.size_._5_1_ = kj::_::Debug::shouldLog(ERROR);
      while ((bool)constArray.size_._5_1_ != false) {
        constArray.size_._4_1_ = 0xf0;
        pcVar4 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)&_kjCondition_20.result,4);
        kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<char,char&>&,char,char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2f3,ERROR,
                   "\"failed: expected \" \"(\'\\\\xf0\') == (chars[4])\", _kjCondition, \'\\xf0\', chars[4]"
                   ,(char (*) [40])"failed: expected (\'\\xf0\') == (chars[4])",
                   (DebugComparison<char,_char_&> *)local_830,(char *)((long)&constArray.size_ + 4),
                   pcVar4);
        constArray.size_._5_1_ = false;
      }
    }
  }
  join_0x00000010_0x00000000_ =
       kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&_kjCondition.result);
  join_0x00000010_0x00000000_ =
       ArrayPtr<const_unsigned_int>::asBytes((ArrayPtr<const_unsigned_int> *)&bytes_1.size_);
  local_888 = 8;
  local_884 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_888);
  f_3.exception =
       (Exception *)
       ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result)
  ;
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_880,&local_884,(unsigned_long *)&f_3);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_880);
  if (!bVar1) {
    local_89c = 8;
    _kjCondition_38._32_8_ =
         ArrayPtr<const_unsigned_char>::size
                   ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              (&local_898,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x2fb,FAILED,"(8) == (bytes.size())","_kjCondition,8, bytes.size()",
               (DebugComparison<int,_unsigned_long> *)local_880,&local_89c,
               (unsigned_long *)&_kjCondition_38.result);
    kj::_::Debug::Fault::fatal(&local_898);
  }
  puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                     ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,0);
  if (*puVar3 == '\x12') {
    local_8d8 = 0x12;
    DStack_8d4 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_8d8);
    puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,0);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_8d0,
               &stack0xfffffffffffff72c,puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_8d0);
    if (!bVar1) {
      _kjCondition_39._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_39._39_1_ != '\0') {
        _kjCondition_39.result = true;
        _kjCondition_39._33_3_ = 0;
        puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,0);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char_const&>&,unsigned_int,unsigned_char_const&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x2ff,ERROR,
                   "\"failed: expected \" \"(0x12u) == (bytes[0])\", _kjCondition, 0x12u, bytes[0]",
                   (char (*) [39])"failed: expected (0x12u) == (bytes[0])",
                   (DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_8d0,
                   (uint *)&_kjCondition_39.result,puVar3);
        _kjCondition_39._39_1_ = 0;
      }
    }
    local_910 = 0x34;
    DStack_90c = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_910);
    puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,1);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_908,
               &stack0xfffffffffffff6f4,puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_908);
    if (!bVar1) {
      _kjCondition_40._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_40._39_1_ != '\0') {
        _kjCondition_40.result = true;
        _kjCondition_40._33_3_ = 0;
        puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,1);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char_const&>&,unsigned_int,unsigned_char_const&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x300,ERROR,
                   "\"failed: expected \" \"(0x34u) == (bytes[1])\", _kjCondition, 0x34u, bytes[1]",
                   (char (*) [39])"failed: expected (0x34u) == (bytes[1])",
                   (DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_908,
                   (uint *)&_kjCondition_40.result,puVar3);
        _kjCondition_40._39_1_ = 0;
      }
    }
    local_948 = 0x56;
    DStack_944 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_948);
    puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,2);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_940,
               &stack0xfffffffffffff6bc,puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_940);
    if (!bVar1) {
      _kjCondition_41._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_41._39_1_ != '\0') {
        _kjCondition_41.result = true;
        _kjCondition_41._33_3_ = 0;
        puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,2);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char_const&>&,unsigned_int,unsigned_char_const&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x301,ERROR,
                   "\"failed: expected \" \"(0x56u) == (bytes[2])\", _kjCondition, 0x56u, bytes[2]",
                   (char (*) [39])"failed: expected (0x56u) == (bytes[2])",
                   (DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_940,
                   (uint *)&_kjCondition_41.result,puVar3);
        _kjCondition_41._39_1_ = 0;
      }
    }
    local_980 = 0x78;
    DStack_97c = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_980);
    puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,3);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_978,
               &stack0xfffffffffffff684,puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_978);
    if (!bVar1) {
      _kjCondition_42._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_42._39_1_ != '\0') {
        _kjCondition_42.result = true;
        _kjCondition_42._33_3_ = 0;
        puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,3);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char_const&>&,unsigned_int,unsigned_char_const&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x302,ERROR,
                   "\"failed: expected \" \"(0x78u) == (bytes[3])\", _kjCondition, 0x78u, bytes[3]",
                   (char (*) [39])"failed: expected (0x78u) == (bytes[3])",
                   (DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_978,
                   (uint *)&_kjCondition_42.result,puVar3);
        _kjCondition_42._39_1_ = 0;
      }
    }
    local_9b8 = 0x9a;
    DStack_9b4 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_9b8);
    puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,4);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_9b0,
               &stack0xfffffffffffff64c,puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_9b0);
    if (!bVar1) {
      _kjCondition_43._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_43._39_1_ != '\0') {
        _kjCondition_43.result = true;
        _kjCondition_43._33_3_ = 0;
        puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,4);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char_const&>&,unsigned_int,unsigned_char_const&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x303,ERROR,
                   "\"failed: expected \" \"(0x9au) == (bytes[4])\", _kjCondition, 0x9au, bytes[4]",
                   (char (*) [39])"failed: expected (0x9au) == (bytes[4])",
                   (DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_9b0,
                   (uint *)&_kjCondition_43.result,puVar3);
        _kjCondition_43._39_1_ = 0;
      }
    }
    local_9f0 = 0xbc;
    DStack_9ec = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_9f0);
    puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,5);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_9e8,
               &stack0xfffffffffffff614,puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_9e8);
    if (!bVar1) {
      _kjCondition_44._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_44._39_1_ != '\0') {
        _kjCondition_44.result = true;
        _kjCondition_44._33_3_ = 0;
        puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,5);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char_const&>&,unsigned_int,unsigned_char_const&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x304,ERROR,
                   "\"failed: expected \" \"(0xbcu) == (bytes[5])\", _kjCondition, 0xbcu, bytes[5]",
                   (char (*) [39])"failed: expected (0xbcu) == (bytes[5])",
                   (DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_9e8,
                   (uint *)&_kjCondition_44.result,puVar3);
        _kjCondition_44._39_1_ = 0;
      }
    }
    local_a28 = 0xde;
    DStack_a24 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_a28);
    puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,6);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_a20,
               &stack0xfffffffffffff5dc,puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a20);
    if (!bVar1) {
      _kjCondition_45._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_45._39_1_ != '\0') {
        _kjCondition_45.result = true;
        _kjCondition_45._33_3_ = 0;
        puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,6);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char_const&>&,unsigned_int,unsigned_char_const&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x305,ERROR,
                   "\"failed: expected \" \"(0xdeu) == (bytes[6])\", _kjCondition, 0xdeu, bytes[6]",
                   (char (*) [39])"failed: expected (0xdeu) == (bytes[6])",
                   (DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_a20,
                   (uint *)&_kjCondition_45.result,puVar3);
        _kjCondition_45._39_1_ = 0;
      }
    }
    local_a60 = 0xf0;
    DStack_a5c = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_a60);
    puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,7);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_a58,
               &stack0xfffffffffffff5a4,puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a58);
    if (!bVar1) {
      _kjCondition_46._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_46._39_1_ != '\0') {
        _kjCondition_46.result = true;
        _kjCondition_46._33_3_ = 0;
        puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,7);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char_const&>&,unsigned_int,unsigned_char_const&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x306,ERROR,
                   "\"failed: expected \" \"(0xf0u) == (bytes[7])\", _kjCondition, 0xf0u, bytes[7]",
                   (char (*) [39])"failed: expected (0xf0u) == (bytes[7])",
                   (DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_a58,
                   (uint *)&_kjCondition_46.result,puVar3);
        _kjCondition_46._39_1_ = 0;
      }
    }
  }
  else {
    local_a98 = 0x12;
    DStack_a94 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_a98);
    puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,3);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_a90,
               &stack0xfffffffffffff56c,puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a90);
    if (!bVar1) {
      _kjCondition_47._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_47._39_1_ != '\0') {
        _kjCondition_47.result = true;
        _kjCondition_47._33_3_ = 0;
        puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,3);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char_const&>&,unsigned_int,unsigned_char_const&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x309,ERROR,
                   "\"failed: expected \" \"(0x12u) == (bytes[3])\", _kjCondition, 0x12u, bytes[3]",
                   (char (*) [39])"failed: expected (0x12u) == (bytes[3])",
                   (DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_a90,
                   (uint *)&_kjCondition_47.result,puVar3);
        _kjCondition_47._39_1_ = 0;
      }
    }
    local_ad0 = 0x34;
    DStack_acc = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_ad0);
    puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,2);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_ac8,
               &stack0xfffffffffffff534,puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_ac8);
    if (!bVar1) {
      _kjCondition_48._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_48._39_1_ != '\0') {
        _kjCondition_48.result = true;
        _kjCondition_48._33_3_ = 0;
        puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,2);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char_const&>&,unsigned_int,unsigned_char_const&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x30a,ERROR,
                   "\"failed: expected \" \"(0x34u) == (bytes[2])\", _kjCondition, 0x34u, bytes[2]",
                   (char (*) [39])"failed: expected (0x34u) == (bytes[2])",
                   (DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_ac8,
                   (uint *)&_kjCondition_48.result,puVar3);
        _kjCondition_48._39_1_ = 0;
      }
    }
    local_b08 = 0x56;
    DStack_b04 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_b08);
    puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,1);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_b00,
               &stack0xfffffffffffff4fc,puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b00);
    if (!bVar1) {
      _kjCondition_49._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_49._39_1_ != '\0') {
        _kjCondition_49.result = true;
        _kjCondition_49._33_3_ = 0;
        puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,1);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char_const&>&,unsigned_int,unsigned_char_const&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x30b,ERROR,
                   "\"failed: expected \" \"(0x56u) == (bytes[1])\", _kjCondition, 0x56u, bytes[1]",
                   (char (*) [39])"failed: expected (0x56u) == (bytes[1])",
                   (DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_b00,
                   (uint *)&_kjCondition_49.result,puVar3);
        _kjCondition_49._39_1_ = 0;
      }
    }
    local_b40 = 0x78;
    DStack_b3c = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_b40);
    puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,0);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_b38,
               &stack0xfffffffffffff4c4,puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b38);
    if (!bVar1) {
      _kjCondition_50._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_50._39_1_ != '\0') {
        _kjCondition_50.result = true;
        _kjCondition_50._33_3_ = 0;
        puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,0);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char_const&>&,unsigned_int,unsigned_char_const&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x30c,ERROR,
                   "\"failed: expected \" \"(0x78u) == (bytes[0])\", _kjCondition, 0x78u, bytes[0]",
                   (char (*) [39])"failed: expected (0x78u) == (bytes[0])",
                   (DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_b38,
                   (uint *)&_kjCondition_50.result,puVar3);
        _kjCondition_50._39_1_ = 0;
      }
    }
    local_b78 = 0x9a;
    DStack_b74 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_b78);
    puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,7);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_b70,
               &stack0xfffffffffffff48c,puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b70);
    if (!bVar1) {
      _kjCondition_51._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_51._39_1_ != '\0') {
        _kjCondition_51.result = true;
        _kjCondition_51._33_3_ = 0;
        puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,7);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char_const&>&,unsigned_int,unsigned_char_const&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x30d,ERROR,
                   "\"failed: expected \" \"(0x9au) == (bytes[7])\", _kjCondition, 0x9au, bytes[7]",
                   (char (*) [39])"failed: expected (0x9au) == (bytes[7])",
                   (DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_b70,
                   (uint *)&_kjCondition_51.result,puVar3);
        _kjCondition_51._39_1_ = 0;
      }
    }
    local_bb0 = 0xbc;
    DStack_bac = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_bb0);
    puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,6);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_ba8,
               &stack0xfffffffffffff454,puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_ba8);
    if (!bVar1) {
      _kjCondition_52._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_52._39_1_ != '\0') {
        _kjCondition_52.result = true;
        _kjCondition_52._33_3_ = 0;
        puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,6);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char_const&>&,unsigned_int,unsigned_char_const&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x30e,ERROR,
                   "\"failed: expected \" \"(0xbcu) == (bytes[6])\", _kjCondition, 0xbcu, bytes[6]",
                   (char (*) [39])"failed: expected (0xbcu) == (bytes[6])",
                   (DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_ba8,
                   (uint *)&_kjCondition_52.result,puVar3);
        _kjCondition_52._39_1_ = 0;
      }
    }
    local_be8 = 0xde;
    DStack_be4 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_be8);
    puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,5);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_be0,
               &stack0xfffffffffffff41c,puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_be0);
    if (!bVar1) {
      _kjCondition_53._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_53._39_1_ != '\0') {
        _kjCondition_53.result = true;
        _kjCondition_53._33_3_ = 0;
        puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,5);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char_const&>&,unsigned_int,unsigned_char_const&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x30f,ERROR,
                   "\"failed: expected \" \"(0xdeu) == (bytes[5])\", _kjCondition, 0xdeu, bytes[5]",
                   (char (*) [39])"failed: expected (0xdeu) == (bytes[5])",
                   (DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_be0,
                   (uint *)&_kjCondition_53.result,puVar3);
        _kjCondition_53._39_1_ = 0;
      }
    }
    local_c20 = 0xf0;
    DStack_c1c = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c20);
    puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,4);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_c18,
               &stack0xfffffffffffff3e4,puVar3);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c18);
    if (!bVar1) {
      chars_1.size_._7_1_ = kj::_::Debug::shouldLog(ERROR);
      while ((bool)chars_1.size_._7_1_ != false) {
        chars_1.size_._0_4_ = 0xf0;
        puVar3 = ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&_kjCondition_37.result,4);
        kj::_::Debug::
        log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_char_const&>&,unsigned_int,unsigned_char_const&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x310,ERROR,
                   "\"failed: expected \" \"(0xf0u) == (bytes[4])\", _kjCondition, 0xf0u, bytes[4]",
                   (char (*) [39])"failed: expected (0xf0u) == (bytes[4])",
                   (DebugComparison<unsigned_int,_const_unsigned_char_&> *)local_c18,
                   (uint *)&chars_1.size_,puVar3);
        chars_1.size_._7_1_ = false;
      }
    }
  }
  join_0x00000010_0x00000000_ =
       ArrayPtr<const_unsigned_int>::asChars((ArrayPtr<const_unsigned_int> *)&bytes_1.size_);
  local_c68 = 8;
  local_c64 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c68);
  f_4.exception =
       (Exception *)ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&_kjCondition_54.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_c60,&local_c64,(unsigned_long *)&f_4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c60);
  if (bVar1) {
    pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&_kjCondition_54.result,0);
    if (*pcVar4 == '\x12') {
      _kjCondition_56._38_1_ = 0x12;
      _kjCondition_56._39_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_56.field_0x26);
      pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&_kjCondition_54.result,0);
      kj::_::DebugExpression<char>::operator==
                ((DebugComparison<char,_const_char_&> *)local_cb0,
                 (DebugExpression<char> *)&_kjCondition_56.field_0x27,pcVar4);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_cb0);
      if (!bVar1) {
        _kjCondition_56._37_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_56._37_1_ != '\0') {
          _kjCondition_56._36_1_ = 0x12;
          pcVar4 = ArrayPtr<const_char>::operator[]
                             ((ArrayPtr<const_char> *)&_kjCondition_54.result,0);
          kj::_::Debug::
          log<char_const(&)[40],kj::_::DebugComparison<char,char_const&>&,char,char_const&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                     ,0x31a,ERROR,
                     "\"failed: expected \" \"(\'\\\\x12\') == (chars[0])\", _kjCondition, \'\\x12\', chars[0]"
                     ,(char (*) [40])"failed: expected (\'\\x12\') == (chars[0])",
                     (DebugComparison<char,_const_char_&> *)local_cb0,&_kjCondition_56.field_0x24,
                     pcVar4);
          _kjCondition_56._37_1_ = 0;
        }
      }
      _kjCondition_57._38_1_ = 0x34;
      _kjCondition_57._39_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_57.field_0x26);
      pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&_kjCondition_54.result,1);
      kj::_::DebugExpression<char>::operator==
                ((DebugComparison<char,_const_char_&> *)local_ce0,
                 (DebugExpression<char> *)&_kjCondition_57.field_0x27,pcVar4);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_ce0);
      if (!bVar1) {
        _kjCondition_57._37_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_57._37_1_ != '\0') {
          _kjCondition_57._36_1_ = 0x34;
          pcVar4 = ArrayPtr<const_char>::operator[]
                             ((ArrayPtr<const_char> *)&_kjCondition_54.result,1);
          kj::_::Debug::
          log<char_const(&)[40],kj::_::DebugComparison<char,char_const&>&,char,char_const&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                     ,0x31b,ERROR,
                     "\"failed: expected \" \"(\'\\\\x34\') == (chars[1])\", _kjCondition, \'\\x34\', chars[1]"
                     ,(char (*) [40])"failed: expected (\'\\x34\') == (chars[1])",
                     (DebugComparison<char,_const_char_&> *)local_ce0,&_kjCondition_57.field_0x24,
                     pcVar4);
          _kjCondition_57._37_1_ = 0;
        }
      }
      _kjCondition_58._38_1_ = 0x56;
      _kjCondition_58._39_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_58.field_0x26);
      pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&_kjCondition_54.result,2);
      kj::_::DebugExpression<char>::operator==
                ((DebugComparison<char,_const_char_&> *)local_d10,
                 (DebugExpression<char> *)&_kjCondition_58.field_0x27,pcVar4);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d10);
      if (!bVar1) {
        _kjCondition_58._37_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_58._37_1_ != '\0') {
          _kjCondition_58._36_1_ = 0x56;
          pcVar4 = ArrayPtr<const_char>::operator[]
                             ((ArrayPtr<const_char> *)&_kjCondition_54.result,2);
          kj::_::Debug::
          log<char_const(&)[40],kj::_::DebugComparison<char,char_const&>&,char,char_const&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                     ,0x31c,ERROR,
                     "\"failed: expected \" \"(\'\\\\x56\') == (chars[2])\", _kjCondition, \'\\x56\', chars[2]"
                     ,(char (*) [40])"failed: expected (\'\\x56\') == (chars[2])",
                     (DebugComparison<char,_const_char_&> *)local_d10,&_kjCondition_58.field_0x24,
                     pcVar4);
          _kjCondition_58._37_1_ = 0;
        }
      }
      _kjCondition_59._38_1_ = 0x78;
      _kjCondition_59._39_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_59.field_0x26);
      pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&_kjCondition_54.result,3);
      kj::_::DebugExpression<char>::operator==
                ((DebugComparison<char,_const_char_&> *)local_d40,
                 (DebugExpression<char> *)&_kjCondition_59.field_0x27,pcVar4);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d40);
      if (!bVar1) {
        _kjCondition_59._37_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_59._37_1_ != '\0') {
          _kjCondition_59._36_1_ = 0x78;
          pcVar4 = ArrayPtr<const_char>::operator[]
                             ((ArrayPtr<const_char> *)&_kjCondition_54.result,3);
          kj::_::Debug::
          log<char_const(&)[40],kj::_::DebugComparison<char,char_const&>&,char,char_const&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                     ,0x31d,ERROR,
                     "\"failed: expected \" \"(\'\\\\x78\') == (chars[3])\", _kjCondition, \'\\x78\', chars[3]"
                     ,(char (*) [40])"failed: expected (\'\\x78\') == (chars[3])",
                     (DebugComparison<char,_const_char_&> *)local_d40,&_kjCondition_59.field_0x24,
                     pcVar4);
          _kjCondition_59._37_1_ = 0;
        }
      }
      _kjCondition_60._38_1_ = 0x9a;
      _kjCondition_60._39_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_60.field_0x26);
      pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&_kjCondition_54.result,4);
      kj::_::DebugExpression<char>::operator==
                ((DebugComparison<char,_const_char_&> *)local_d70,
                 (DebugExpression<char> *)&_kjCondition_60.field_0x27,pcVar4);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d70);
      if (!bVar1) {
        _kjCondition_60._37_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_60._37_1_ != '\0') {
          _kjCondition_60._36_1_ = 0x9a;
          pcVar4 = ArrayPtr<const_char>::operator[]
                             ((ArrayPtr<const_char> *)&_kjCondition_54.result,4);
          kj::_::Debug::
          log<char_const(&)[40],kj::_::DebugComparison<char,char_const&>&,char,char_const&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                     ,0x31e,ERROR,
                     "\"failed: expected \" \"(\'\\\\x9a\') == (chars[4])\", _kjCondition, \'\\x9a\', chars[4]"
                     ,(char (*) [40])"failed: expected (\'\\x9a\') == (chars[4])",
                     (DebugComparison<char,_const_char_&> *)local_d70,&_kjCondition_60.field_0x24,
                     pcVar4);
          _kjCondition_60._37_1_ = 0;
        }
      }
      _kjCondition_61._38_1_ = 0xbc;
      _kjCondition_61._39_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_61.field_0x26);
      pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&_kjCondition_54.result,5);
      kj::_::DebugExpression<char>::operator==
                ((DebugComparison<char,_const_char_&> *)local_da0,
                 (DebugExpression<char> *)&_kjCondition_61.field_0x27,pcVar4);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_da0);
      if (!bVar1) {
        _kjCondition_61._37_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_61._37_1_ != '\0') {
          _kjCondition_61._36_1_ = 0xbc;
          pcVar4 = ArrayPtr<const_char>::operator[]
                             ((ArrayPtr<const_char> *)&_kjCondition_54.result,5);
          kj::_::Debug::
          log<char_const(&)[40],kj::_::DebugComparison<char,char_const&>&,char,char_const&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                     ,799,ERROR,
                     "\"failed: expected \" \"(\'\\\\xbc\') == (chars[5])\", _kjCondition, \'\\xbc\', chars[5]"
                     ,(char (*) [40])"failed: expected (\'\\xbc\') == (chars[5])",
                     (DebugComparison<char,_const_char_&> *)local_da0,&_kjCondition_61.field_0x24,
                     pcVar4);
          _kjCondition_61._37_1_ = 0;
        }
      }
      _kjCondition_62._38_1_ = 0xde;
      _kjCondition_62._39_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_62.field_0x26);
      pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&_kjCondition_54.result,6);
      kj::_::DebugExpression<char>::operator==
                ((DebugComparison<char,_const_char_&> *)local_dd0,
                 (DebugExpression<char> *)&_kjCondition_62.field_0x27,pcVar4);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_dd0);
      if (!bVar1) {
        _kjCondition_62._37_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_62._37_1_ != '\0') {
          _kjCondition_62._36_1_ = 0xde;
          pcVar4 = ArrayPtr<const_char>::operator[]
                             ((ArrayPtr<const_char> *)&_kjCondition_54.result,6);
          kj::_::Debug::
          log<char_const(&)[40],kj::_::DebugComparison<char,char_const&>&,char,char_const&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                     ,800,ERROR,
                     "\"failed: expected \" \"(\'\\\\xde\') == (chars[6])\", _kjCondition, \'\\xde\', chars[6]"
                     ,(char (*) [40])"failed: expected (\'\\xde\') == (chars[6])",
                     (DebugComparison<char,_const_char_&> *)local_dd0,&_kjCondition_62.field_0x24,
                     pcVar4);
          _kjCondition_62._37_1_ = 0;
        }
      }
      _kjCondition_63._38_1_ = 0xf0;
      _kjCondition_63._39_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_63.field_0x26);
      pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&_kjCondition_54.result,7);
      kj::_::DebugExpression<char>::operator==
                ((DebugComparison<char,_const_char_&> *)local_e00,
                 (DebugExpression<char> *)&_kjCondition_63.field_0x27,pcVar4);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e00);
      if (!bVar1) {
        _kjCondition_63._37_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_63._37_1_ != '\0') {
          _kjCondition_63._36_1_ = 0xf0;
          pcVar4 = ArrayPtr<const_char>::operator[]
                             ((ArrayPtr<const_char> *)&_kjCondition_54.result,7);
          kj::_::Debug::
          log<char_const(&)[40],kj::_::DebugComparison<char,char_const&>&,char,char_const&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                     ,0x321,ERROR,
                     "\"failed: expected \" \"(\'\\\\xf0\') == (chars[7])\", _kjCondition, \'\\xf0\', chars[7]"
                     ,(char (*) [40])"failed: expected (\'\\xf0\') == (chars[7])",
                     (DebugComparison<char,_const_char_&> *)local_e00,&_kjCondition_63.field_0x24,
                     pcVar4);
          _kjCondition_63._37_1_ = 0;
        }
      }
    }
    else {
      _kjCondition_64._38_1_ = 0x12;
      _kjCondition_64._39_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_64.field_0x26);
      pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&_kjCondition_54.result,3);
      kj::_::DebugExpression<char>::operator==
                ((DebugComparison<char,_const_char_&> *)local_e30,
                 (DebugExpression<char> *)&_kjCondition_64.field_0x27,pcVar4);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e30);
      if (!bVar1) {
        _kjCondition_64._37_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_64._37_1_ != '\0') {
          _kjCondition_64._36_1_ = 0x12;
          pcVar4 = ArrayPtr<const_char>::operator[]
                             ((ArrayPtr<const_char> *)&_kjCondition_54.result,3);
          kj::_::Debug::
          log<char_const(&)[40],kj::_::DebugComparison<char,char_const&>&,char,char_const&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                     ,0x324,ERROR,
                     "\"failed: expected \" \"(\'\\\\x12\') == (chars[3])\", _kjCondition, \'\\x12\', chars[3]"
                     ,(char (*) [40])"failed: expected (\'\\x12\') == (chars[3])",
                     (DebugComparison<char,_const_char_&> *)local_e30,&_kjCondition_64.field_0x24,
                     pcVar4);
          _kjCondition_64._37_1_ = 0;
        }
      }
      _kjCondition_65._38_1_ = 0x34;
      _kjCondition_65._39_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_65.field_0x26);
      pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&_kjCondition_54.result,2);
      kj::_::DebugExpression<char>::operator==
                ((DebugComparison<char,_const_char_&> *)local_e60,
                 (DebugExpression<char> *)&_kjCondition_65.field_0x27,pcVar4);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e60);
      if (!bVar1) {
        _kjCondition_65._37_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_65._37_1_ != '\0') {
          _kjCondition_65._36_1_ = 0x34;
          pcVar4 = ArrayPtr<const_char>::operator[]
                             ((ArrayPtr<const_char> *)&_kjCondition_54.result,2);
          kj::_::Debug::
          log<char_const(&)[40],kj::_::DebugComparison<char,char_const&>&,char,char_const&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                     ,0x325,ERROR,
                     "\"failed: expected \" \"(\'\\\\x34\') == (chars[2])\", _kjCondition, \'\\x34\', chars[2]"
                     ,(char (*) [40])"failed: expected (\'\\x34\') == (chars[2])",
                     (DebugComparison<char,_const_char_&> *)local_e60,&_kjCondition_65.field_0x24,
                     pcVar4);
          _kjCondition_65._37_1_ = 0;
        }
      }
      _kjCondition_66._38_1_ = 0x56;
      _kjCondition_66._39_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_66.field_0x26);
      pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&_kjCondition_54.result,1);
      kj::_::DebugExpression<char>::operator==
                ((DebugComparison<char,_const_char_&> *)local_e90,
                 (DebugExpression<char> *)&_kjCondition_66.field_0x27,pcVar4);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e90);
      if (!bVar1) {
        _kjCondition_66._37_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_66._37_1_ != '\0') {
          _kjCondition_66._36_1_ = 0x56;
          pcVar4 = ArrayPtr<const_char>::operator[]
                             ((ArrayPtr<const_char> *)&_kjCondition_54.result,1);
          kj::_::Debug::
          log<char_const(&)[40],kj::_::DebugComparison<char,char_const&>&,char,char_const&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                     ,0x326,ERROR,
                     "\"failed: expected \" \"(\'\\\\x56\') == (chars[1])\", _kjCondition, \'\\x56\', chars[1]"
                     ,(char (*) [40])"failed: expected (\'\\x56\') == (chars[1])",
                     (DebugComparison<char,_const_char_&> *)local_e90,&_kjCondition_66.field_0x24,
                     pcVar4);
          _kjCondition_66._37_1_ = 0;
        }
      }
      _kjCondition_67._38_1_ = 0x78;
      _kjCondition_67._39_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_67.field_0x26);
      pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&_kjCondition_54.result,0);
      kj::_::DebugExpression<char>::operator==
                ((DebugComparison<char,_const_char_&> *)local_ec0,
                 (DebugExpression<char> *)&_kjCondition_67.field_0x27,pcVar4);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_ec0);
      if (!bVar1) {
        _kjCondition_67._37_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_67._37_1_ != '\0') {
          _kjCondition_67._36_1_ = 0x78;
          pcVar4 = ArrayPtr<const_char>::operator[]
                             ((ArrayPtr<const_char> *)&_kjCondition_54.result,0);
          kj::_::Debug::
          log<char_const(&)[40],kj::_::DebugComparison<char,char_const&>&,char,char_const&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                     ,0x327,ERROR,
                     "\"failed: expected \" \"(\'\\\\x78\') == (chars[0])\", _kjCondition, \'\\x78\', chars[0]"
                     ,(char (*) [40])"failed: expected (\'\\x78\') == (chars[0])",
                     (DebugComparison<char,_const_char_&> *)local_ec0,&_kjCondition_67.field_0x24,
                     pcVar4);
          _kjCondition_67._37_1_ = 0;
        }
      }
      _kjCondition_68._38_1_ = 0x9a;
      _kjCondition_68._39_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_68.field_0x26);
      pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&_kjCondition_54.result,7);
      kj::_::DebugExpression<char>::operator==
                ((DebugComparison<char,_const_char_&> *)local_ef0,
                 (DebugExpression<char> *)&_kjCondition_68.field_0x27,pcVar4);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_ef0);
      if (!bVar1) {
        _kjCondition_68._37_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_68._37_1_ != '\0') {
          _kjCondition_68._36_1_ = 0x9a;
          pcVar4 = ArrayPtr<const_char>::operator[]
                             ((ArrayPtr<const_char> *)&_kjCondition_54.result,7);
          kj::_::Debug::
          log<char_const(&)[40],kj::_::DebugComparison<char,char_const&>&,char,char_const&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                     ,0x328,ERROR,
                     "\"failed: expected \" \"(\'\\\\x9a\') == (chars[7])\", _kjCondition, \'\\x9a\', chars[7]"
                     ,(char (*) [40])"failed: expected (\'\\x9a\') == (chars[7])",
                     (DebugComparison<char,_const_char_&> *)local_ef0,&_kjCondition_68.field_0x24,
                     pcVar4);
          _kjCondition_68._37_1_ = 0;
        }
      }
      _kjCondition_69._38_1_ = 0xbc;
      _kjCondition_69._39_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_69.field_0x26);
      pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&_kjCondition_54.result,6);
      kj::_::DebugExpression<char>::operator==
                ((DebugComparison<char,_const_char_&> *)local_f20,
                 (DebugExpression<char> *)&_kjCondition_69.field_0x27,pcVar4);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f20);
      if (!bVar1) {
        _kjCondition_69._37_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_69._37_1_ != '\0') {
          _kjCondition_69._36_1_ = 0xbc;
          pcVar4 = ArrayPtr<const_char>::operator[]
                             ((ArrayPtr<const_char> *)&_kjCondition_54.result,6);
          kj::_::Debug::
          log<char_const(&)[40],kj::_::DebugComparison<char,char_const&>&,char,char_const&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                     ,0x329,ERROR,
                     "\"failed: expected \" \"(\'\\\\xbc\') == (chars[6])\", _kjCondition, \'\\xbc\', chars[6]"
                     ,(char (*) [40])"failed: expected (\'\\xbc\') == (chars[6])",
                     (DebugComparison<char,_const_char_&> *)local_f20,&_kjCondition_69.field_0x24,
                     pcVar4);
          _kjCondition_69._37_1_ = 0;
        }
      }
      _kjCondition_70._38_1_ = 0xde;
      _kjCondition_70._39_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_70.field_0x26);
      pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&_kjCondition_54.result,5);
      kj::_::DebugExpression<char>::operator==
                ((DebugComparison<char,_const_char_&> *)local_f50,
                 (DebugExpression<char> *)&_kjCondition_70.field_0x27,pcVar4);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f50);
      if (!bVar1) {
        _kjCondition_70._37_1_ = kj::_::Debug::shouldLog(ERROR);
        while (_kjCondition_70._37_1_ != '\0') {
          _kjCondition_70._36_1_ = 0xde;
          pcVar4 = ArrayPtr<const_char>::operator[]
                             ((ArrayPtr<const_char> *)&_kjCondition_54.result,5);
          kj::_::Debug::
          log<char_const(&)[40],kj::_::DebugComparison<char,char_const&>&,char,char_const&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                     ,0x32a,ERROR,
                     "\"failed: expected \" \"(\'\\\\xde\') == (chars[5])\", _kjCondition, \'\\xde\', chars[5]"
                     ,(char (*) [40])"failed: expected (\'\\xde\') == (chars[5])",
                     (DebugComparison<char,_const_char_&> *)local_f50,&_kjCondition_70.field_0x24,
                     pcVar4);
          _kjCondition_70._37_1_ = 0;
        }
      }
      local_f82 = -0x10;
      local_f81 = kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_f82);
      pcVar4 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&_kjCondition_54.result,4);
      kj::_::DebugExpression<char>::operator==
                ((DebugComparison<char,_const_char_&> *)local_f80,&local_f81,pcVar4);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f80);
      if (!bVar1) {
        local_f83 = kj::_::Debug::shouldLog(ERROR);
        while (local_f83 != false) {
          local_f84 = -0x10;
          pcVar4 = ArrayPtr<const_char>::operator[]
                             ((ArrayPtr<const_char> *)&_kjCondition_54.result,4);
          kj::_::Debug::
          log<char_const(&)[40],kj::_::DebugComparison<char,char_const&>&,char,char_const&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                     ,0x32b,ERROR,
                     "\"failed: expected \" \"(\'\\\\xf0\') == (chars[4])\", _kjCondition, \'\\xf0\', chars[4]"
                     ,(char (*) [40])"failed: expected (\'\\xf0\') == (chars[4])",
                     (DebugComparison<char,_const_char_&> *)local_f80,&local_f84,pcVar4);
          local_f83 = false;
        }
      }
    }
    return;
  }
  local_c7c = 8;
  _kjCondition_55._32_8_ =
       ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&_kjCondition_54.result);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
            (&local_c78,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
             ,0x316,FAILED,"(8) == (chars.size())","_kjCondition,8, chars.size()",
             (DebugComparison<int,_unsigned_long> *)local_c60,&local_c7c,
             (unsigned_long *)&_kjCondition_55.result);
  kj::_::Debug::Fault::fatal(&local_c78);
}

Assistant:

TEST(Common, ArrayAsBytes) {
  uint32_t raw[] = { 0x12345678u, 0x9abcdef0u };

  ArrayPtr<uint32_t> array = raw;
  ASSERT_EQ(2, array.size());
  EXPECT_EQ(0x12345678u, array[0]);
  EXPECT_EQ(0x9abcdef0u, array[1]);

  {
    ArrayPtr<byte> bytes = array.asBytes();
    ASSERT_EQ(8, bytes.size());

    if (bytes[0] == '\x12') {
      // big-endian
      EXPECT_EQ(0x12u, bytes[0]);
      EXPECT_EQ(0x34u, bytes[1]);
      EXPECT_EQ(0x56u, bytes[2]);
      EXPECT_EQ(0x78u, bytes[3]);
      EXPECT_EQ(0x9au, bytes[4]);
      EXPECT_EQ(0xbcu, bytes[5]);
      EXPECT_EQ(0xdeu, bytes[6]);
      EXPECT_EQ(0xf0u, bytes[7]);
    } else {
      // little-endian
      EXPECT_EQ(0x12u, bytes[3]);
      EXPECT_EQ(0x34u, bytes[2]);
      EXPECT_EQ(0x56u, bytes[1]);
      EXPECT_EQ(0x78u, bytes[0]);
      EXPECT_EQ(0x9au, bytes[7]);
      EXPECT_EQ(0xbcu, bytes[6]);
      EXPECT_EQ(0xdeu, bytes[5]);
      EXPECT_EQ(0xf0u, bytes[4]);
    }
  }

  {
    ArrayPtr<char> chars = array.asChars();
    ASSERT_EQ(8, chars.size());

    if (chars[0] == '\x12') {
      // big-endian
      EXPECT_EQ('\x12', chars[0]);
      EXPECT_EQ('\x34', chars[1]);
      EXPECT_EQ('\x56', chars[2]);
      EXPECT_EQ('\x78', chars[3]);
      EXPECT_EQ('\x9a', chars[4]);
      EXPECT_EQ('\xbc', chars[5]);
      EXPECT_EQ('\xde', chars[6]);
      EXPECT_EQ('\xf0', chars[7]);
    } else {
      // little-endian
      EXPECT_EQ('\x12', chars[3]);
      EXPECT_EQ('\x34', chars[2]);
      EXPECT_EQ('\x56', chars[1]);
      EXPECT_EQ('\x78', chars[0]);
      EXPECT_EQ('\x9a', chars[7]);
      EXPECT_EQ('\xbc', chars[6]);
      EXPECT_EQ('\xde', chars[5]);
      EXPECT_EQ('\xf0', chars[4]);
    }
  }

  ArrayPtr<const uint32_t> constArray = array;

  {
    ArrayPtr<const byte> bytes = constArray.asBytes();
    ASSERT_EQ(8, bytes.size());

    if (bytes[0] == '\x12') {
      // big-endian
      EXPECT_EQ(0x12u, bytes[0]);
      EXPECT_EQ(0x34u, bytes[1]);
      EXPECT_EQ(0x56u, bytes[2]);
      EXPECT_EQ(0x78u, bytes[3]);
      EXPECT_EQ(0x9au, bytes[4]);
      EXPECT_EQ(0xbcu, bytes[5]);
      EXPECT_EQ(0xdeu, bytes[6]);
      EXPECT_EQ(0xf0u, bytes[7]);
    } else {
      // little-endian
      EXPECT_EQ(0x12u, bytes[3]);
      EXPECT_EQ(0x34u, bytes[2]);
      EXPECT_EQ(0x56u, bytes[1]);
      EXPECT_EQ(0x78u, bytes[0]);
      EXPECT_EQ(0x9au, bytes[7]);
      EXPECT_EQ(0xbcu, bytes[6]);
      EXPECT_EQ(0xdeu, bytes[5]);
      EXPECT_EQ(0xf0u, bytes[4]);
    }
  }

  {
    ArrayPtr<const char> chars = constArray.asChars();
    ASSERT_EQ(8, chars.size());

    if (chars[0] == '\x12') {
      // big-endian
      EXPECT_EQ('\x12', chars[0]);
      EXPECT_EQ('\x34', chars[1]);
      EXPECT_EQ('\x56', chars[2]);
      EXPECT_EQ('\x78', chars[3]);
      EXPECT_EQ('\x9a', chars[4]);
      EXPECT_EQ('\xbc', chars[5]);
      EXPECT_EQ('\xde', chars[6]);
      EXPECT_EQ('\xf0', chars[7]);
    } else {
      // little-endian
      EXPECT_EQ('\x12', chars[3]);
      EXPECT_EQ('\x34', chars[2]);
      EXPECT_EQ('\x56', chars[1]);
      EXPECT_EQ('\x78', chars[0]);
      EXPECT_EQ('\x9a', chars[7]);
      EXPECT_EQ('\xbc', chars[6]);
      EXPECT_EQ('\xde', chars[5]);
      EXPECT_EQ('\xf0', chars[4]);
    }
  }
}